

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffdrec(fitsfile *fptr,int keypos,int *status)

{
  LONGLONG *pLVar1;
  FITSfile *pFVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  char *buffer;
  long lVar6;
  long bytepos;
  int iVar7;
  char *buffer_00;
  char buff2 [81];
  char buff1 [81];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (0 < keypos) {
    pFVar2 = fptr->Fptr;
    bytepos = pFVar2->headend;
    if ((long)(ulong)(uint)keypos <= pFVar2->headstart[pFVar2->curhdu] / -0x50 + bytepos) {
      lVar6 = pFVar2->headstart[pFVar2->curhdu] + (ulong)(keypos * 0x50 - 0x50);
      pFVar2->nextkey = lVar6;
      uVar4 = (bytepos - lVar6) / 0x50;
      if (0 < (int)uVar4) {
        builtin_strncpy(buff2 + 0x20,"        ",9);
        builtin_strncpy(buff2 + 0x10,"                ",0x10);
        builtin_strncpy(buff2,"                ",0x10);
        sVar5 = strlen(buff2);
        builtin_strncpy(buff2 + sVar5,"                                        ",0x29);
        pcVar3 = buff1;
        buffer_00 = buff2;
        while( true ) {
          buffer = pcVar3;
          bytepos = bytepos + -0x50;
          iVar7 = (int)uVar4;
          uVar4 = (ulong)(iVar7 - 1);
          if (iVar7 == 0) break;
          ffmbyt(fptr,bytepos,0,status);
          ffgbyt(fptr,0x50,buffer,status);
          ffmbyt(fptr,bytepos,0,status);
          ffpbyt(fptr,0x50,buffer_00,status);
          pcVar3 = buffer_00;
          buffer_00 = buffer;
        }
        pLVar1 = &fptr->Fptr->headend;
        *pLVar1 = *pLVar1 + -0x50;
        return *status;
      }
      snprintf(buff1,0x51,"Cannot delete keyword number %d.  It does not exist.",(ulong)(uint)keypos
              );
      ffpmsg(buff1);
    }
  }
  *status = 0xcb;
  return 0xcb;
}

Assistant:

int ffdrec(fitsfile *fptr,   /* I - FITS file pointer  */
           int keypos,       /* I - position in header of keyword to delete */
           int *status)      /* IO - error status      */
/*
  Delete a header keyword at position keypos. The 1st keyword is at keypos=1.
*/
{
    int ii, nshift;
    LONGLONG bytepos;
    char *inbuff, *outbuff, *tmpbuff, buff1[81], buff2[81];
    char message[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (keypos < 1 ||
        keypos > (fptr->Fptr)->headend - (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] / 80 )
        return(*status = KEY_OUT_BOUNDS);

    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] + (keypos - 1) * 80;

    nshift=(int) (( (fptr->Fptr)->headend - (fptr->Fptr)->nextkey ) / 80); /* no. keywords to shift */

    if (nshift <= 0)
    {
        snprintf(message, FLEN_ERRMSG,"Cannot delete keyword number %d.  It does not exist.",
                keypos);
        ffpmsg(message);
        return(*status = KEY_OUT_BOUNDS);
    }

    bytepos = (fptr->Fptr)->headend - 80;  /* last keyword in header */  

    /* construct a blank keyword */
    strcpy(buff2, "                                        ");
    strcat(buff2, "                                        ");
    inbuff  = buff1;
    outbuff = buff2;
    for (ii = 0; ii < nshift; ii++) /* shift each keyword up one position */
    {

        ffmbyt(fptr, bytepos, REPORT_EOF, status);
        ffgbyt(fptr, 80, inbuff, status);   /* read the current keyword */

        ffmbyt(fptr, bytepos, REPORT_EOF, status);
        ffpbyt(fptr, 80, outbuff, status);  /* overwrite with next keyword */

        tmpbuff = inbuff;   /* swap input and output buffers */
        inbuff = outbuff;
        outbuff = tmpbuff;

        bytepos -= 80;
    }

    (fptr->Fptr)->headend -= 80; /* decrement the position of the END keyword */
    return(*status);
}